

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makePointer(TranslateToFuzzReader *this)

{
  Builder *this_00;
  address64_t aVar1;
  bool bVar2;
  Expression *left;
  Const *right;
  Binary *pBVar3;
  BinaryOp BStack_30;
  
  left = make(this,(Type)*(uintptr_t *)
                          ((long)(((this->wasm->memories).
                                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                          + 0x50));
  if (this->allowOOB == true) {
    bVar2 = Random::oneIn(&this->random,10);
    if (bVar2) {
      return left;
    }
  }
  this_00 = &this->builder;
  aVar1 = (this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr;
  if (*(long *)((long)(((this->wasm->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x50
               ) == 3) {
    right = Builder::makeConst<long>(this_00,aVar1 - 1);
    BStack_30 = AndInt64;
  }
  else {
    right = Builder::makeConst<int>(this_00,(int)aVar1 + -1);
    BStack_30 = AndInt32;
  }
  pBVar3 = Builder::makeBinary(this_00,BStack_30,left,(Expression *)right);
  return (Expression *)pBVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makePointer() {
  auto* ret = make(wasm.memories[0]->addressType);
  // with high probability, mask the pointer so it's in a reasonable
  // range. otherwise, most pointers are going to be out of range and
  // most memory ops will just trap
  if (!allowOOB || !oneIn(10)) {
    if (wasm.memories[0]->is64()) {
      ret = builder.makeBinary(
        AndInt64,
        ret,
        builder.makeConst(int64_t(fuzzParams->USABLE_MEMORY - 1)));
    } else {
      ret = builder.makeBinary(
        AndInt32,
        ret,
        builder.makeConst(int32_t(fuzzParams->USABLE_MEMORY - 1)));
    }
  }
  return ret;
}